

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

TValue * cpcparser(lua_State *L,lua_CFunction dummy,void *ud)

{
  CPState *in_RDX;
  long in_RDI;
  CPState *cp;
  CPState *in_stack_00000650;
  CPState *in_stack_00000690;
  ErrMsg in_stack_ffffffffffffffdc;
  
  *(undefined4 *)(*(long *)(in_RDI + 0x30) + 0x14) = 0xffffffff;
  cp_init((CPState *)0x1a9da7);
  if ((in_RDX->mode & 1) == 0) {
    cp_decl_single(in_stack_00000650);
  }
  else {
    cp_decl_multi(in_stack_00000690);
  }
  if ((in_RDX->param != (TValue *)0x0) && (in_RDX->param != in_RDX->L->top)) {
    cp_err(in_RDX,in_stack_ffffffffffffffdc);
  }
  return (TValue *)0x0;
}

Assistant:

static TValue *cpcparser(lua_State *L, lua_CFunction dummy, void *ud)
{
  CPState *cp = (CPState *)ud;
  UNUSED(dummy);
  cframe_errfunc(L->cframe) = -1;  /* Inherit error function. */
  cp_init(cp);
  if ((cp->mode & CPARSE_MODE_MULTI))
    cp_decl_multi(cp);
  else
    cp_decl_single(cp);
  if (cp->param && cp->param != cp->L->top)
    cp_err(cp, LJ_ERR_FFI_NUMPARAM);
  lj_assertCP(cp->depth == 0, "unbalanced cparser declaration depth");
  return NULL;
}